

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# units.cpp
# Opt level: O2

void setupFlattenImportedUnits(ImporterPtr *importer,ModelPtr *model,string *variation)

{
  shared_ptr *psVar1;
  element_type *peVar2;
  bool bVar3;
  ModelPtr *pMVar4;
  __shared_ptr<libcellml::Importer,_(__gnu_cxx::_Lock_policy)2> local_140 [2];
  allocator<char> local_11b;
  allocator<char> local_11a;
  allocator<char> local_119;
  __shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2> local_118 [2];
  ModelPtr intermediaryImportModel2;
  ModelPtr intermediaryImportModel1;
  ModelPtr unitsDefinitionsModel;
  UnitsPtr iu4;
  UnitsPtr iu3;
  ImportSourcePtr importIntermediary2;
  ImportSourcePtr importIntermediary1;
  UnitsPtr iu2;
  UnitsPtr iu1;
  ImportSourcePtr import;
  UnitsPtr u;
  allocator<char> local_48 [32];
  
  unitsDefinitionsModel.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  unitsDefinitionsModel.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>._M_refcount
  ._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_140,"importer/units/units_definitions.cellml",
             (allocator<char> *)local_118);
  createBaseModelImport((ModelPtr *)&import,(string *)&unitsDefinitionsModel);
  std::__cxx11::string::~string((string *)local_140);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_140,"import_model1",(allocator<char> *)local_118);
  libcellml::Model::create((string *)&intermediaryImportModel1);
  std::__cxx11::string::~string((string *)local_140);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_140,"import_model2",(allocator<char> *)local_118);
  libcellml::Model::create((string *)&intermediaryImportModel2);
  std::__cxx11::string::~string((string *)local_140);
  libcellml::Importer::create(SUB81(local_140,0));
  std::__shared_ptr<libcellml::Importer,_(__gnu_cxx::_Lock_policy)2>::operator=
            (&importer->super___shared_ptr<libcellml::Importer,_(__gnu_cxx::_Lock_policy)2>,
             local_140);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_140[0]._M_refcount);
  psVar1 = (shared_ptr *)
           (importer->super___shared_ptr<libcellml::Importer,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_140,"units_definitions",(allocator<char> *)local_118);
  libcellml::Importer::addModel(psVar1,(string *)&unitsDefinitionsModel);
  std::__cxx11::string::~string((string *)local_140);
  psVar1 = (shared_ptr *)
           (importer->super___shared_ptr<libcellml::Importer,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_140,"int1",(allocator<char> *)local_118);
  libcellml::Importer::addModel(psVar1,(string *)&intermediaryImportModel1);
  std::__cxx11::string::~string((string *)local_140);
  psVar1 = (shared_ptr *)
           (importer->super___shared_ptr<libcellml::Importer,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_140,"int2",(allocator<char> *)local_118);
  libcellml::Importer::addModel(psVar1,(string *)&intermediaryImportModel2);
  std::__cxx11::string::~string((string *)local_140);
  std::__cxx11::string::string<std::allocator<char>>((string *)local_140,"main_model",local_48);
  libcellml::Model::create((string *)local_118);
  std::__shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>::operator=
            (&model->super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>,local_118);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_118[0]._M_refcount);
  std::__cxx11::string::~string((string *)local_140);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_140,"per_fmol",(allocator<char> *)local_118);
  libcellml::Units::create((string *)&iu1);
  std::__cxx11::string::~string((string *)local_140);
  libcellml::ImportedEntity::setImportSource
            ((shared_ptr *)
             (iu1.super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>._M_ptr + 0x10));
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_140,"per_fmol",(allocator<char> *)local_118);
  libcellml::ImportedEntity::setImportReference
            ((string *)
             (iu1.super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>._M_ptr + 0x10));
  std::__cxx11::string::~string((string *)local_140);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_140,"fmol",(allocator<char> *)local_118);
  libcellml::Units::create((string *)&iu2);
  std::__cxx11::string::~string((string *)local_140);
  libcellml::ImportedEntity::setImportSource
            ((shared_ptr *)
             (iu2.super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>._M_ptr + 0x10));
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_140,"fmol",(allocator<char> *)local_118);
  libcellml::ImportedEntity::setImportReference
            ((string *)
             (iu2.super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>._M_ptr + 0x10));
  std::__cxx11::string::~string((string *)local_140);
  libcellml::Model::addUnits
            ((shared_ptr *)
             intermediaryImportModel1.
             super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  libcellml::Model::addUnits
            ((shared_ptr *)
             intermediaryImportModel2.
             super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  libcellml::ImportSource::create();
  peVar2 = importIntermediary1.
           super___shared_ptr<libcellml::ImportSource,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_140,"I_am_a_url",(allocator<char> *)local_118);
  libcellml::ImportSource::setUrl((string *)peVar2);
  std::__cxx11::string::~string((string *)local_140);
  libcellml::ImportSource::setModel
            ((shared_ptr *)
             importIntermediary1.
             super___shared_ptr<libcellml::ImportSource,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  libcellml::ImportSource::create();
  peVar2 = importIntermediary2.
           super___shared_ptr<libcellml::ImportSource,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_140,"I_am_a_url",(allocator<char> *)local_118);
  libcellml::ImportSource::setUrl((string *)peVar2);
  std::__cxx11::string::~string((string *)local_140);
  libcellml::ImportSource::setModel
            ((shared_ptr *)
             importIntermediary2.
             super___shared_ptr<libcellml::ImportSource,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_140,"per_fmol",(allocator<char> *)local_118);
  libcellml::Units::create((string *)&iu3);
  std::__cxx11::string::~string((string *)local_140);
  libcellml::ImportedEntity::setImportSource
            ((shared_ptr *)
             (iu3.super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>._M_ptr + 0x10));
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_140,"per_fmol",(allocator<char> *)local_118);
  libcellml::ImportedEntity::setImportReference
            ((string *)
             (iu3.super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>._M_ptr + 0x10));
  std::__cxx11::string::~string((string *)local_140);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_140,"fmol",(allocator<char> *)local_118);
  libcellml::Units::create((string *)&iu4);
  std::__cxx11::string::~string((string *)local_140);
  libcellml::ImportedEntity::setImportSource
            ((shared_ptr *)
             (iu4.super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>._M_ptr + 0x10));
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_140,"fmol",(allocator<char> *)local_118);
  libcellml::ImportedEntity::setImportReference
            ((string *)
             (iu4.super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>._M_ptr + 0x10));
  std::__cxx11::string::~string((string *)local_140);
  if (variation->_M_string_length == 0) goto LAB_0014339f;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_140,"fmol",(allocator<char> *)local_118);
  libcellml::Units::create((string *)&u);
  std::__cxx11::string::~string((string *)local_140);
  std::__cxx11::string::string<std::allocator<char>>((string *)local_140,"mole",&local_119);
  std::__cxx11::string::string<std::allocator<char>>((string *)local_118,"femto",&local_11a);
  std::__cxx11::string::string<std::allocator<char>>((string *)local_48,"",&local_11b);
  libcellml::Units::addUnit
            ((string *)u.super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
             (string *)local_140,1.0,1.0,(string *)local_118);
  std::__cxx11::string::~string((string *)local_48);
  std::__cxx11::string::~string((string *)local_118);
  std::__cxx11::string::~string((string *)local_140);
  bVar3 = std::operator==(variation,"int1");
  pMVar4 = &intermediaryImportModel1;
  if (bVar3) {
LAB_00143382:
    libcellml::Model::addUnits
              ((shared_ptr *)
               (pMVar4->super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>)._M_ptr);
  }
  else {
    bVar3 = std::operator==(variation,"main");
    pMVar4 = model;
    if (bVar3) goto LAB_00143382;
  }
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&u.super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
LAB_0014339f:
  libcellml::Model::addUnits
            ((shared_ptr *)
             (model->super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>)._M_ptr);
  libcellml::Model::addUnits
            ((shared_ptr *)
             (model->super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>)._M_ptr);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&iu4.super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&iu3.super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&importIntermediary2.
              super___shared_ptr<libcellml::ImportSource,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&importIntermediary1.
              super___shared_ptr<libcellml::ImportSource,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&iu2.super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&iu1.super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&intermediaryImportModel2.
              super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&intermediaryImportModel1.
              super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&import.super___shared_ptr<libcellml::ImportSource,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&unitsDefinitionsModel.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount);
  return;
}

Assistant:

void setupFlattenImportedUnits(libcellml::ImporterPtr &importer, libcellml::ModelPtr &model, const std::string &variation)
{
    libcellml::ModelPtr unitsDefinitionsModel;
    libcellml::ImportSourcePtr import = createBaseModelImport(unitsDefinitionsModel, "importer/units/units_definitions.cellml");

    libcellml::ModelPtr intermediaryImportModel1 = libcellml::Model::create("import_model1");
    libcellml::ModelPtr intermediaryImportModel2 = libcellml::Model::create("import_model2");

    importer = libcellml::Importer::create();

    importer->addModel(unitsDefinitionsModel, "units_definitions");
    importer->addModel(intermediaryImportModel1, "int1");
    importer->addModel(intermediaryImportModel2, "int2");

    model = libcellml::Model::create("main_model");

    libcellml::UnitsPtr iu1 = libcellml::Units::create("per_fmol");
    iu1->setImportSource(import);
    iu1->setImportReference("per_fmol");

    libcellml::UnitsPtr iu2 = libcellml::Units::create("fmol");
    iu2->setImportSource(import);
    iu2->setImportReference("fmol");

    intermediaryImportModel1->addUnits(iu1);
    intermediaryImportModel2->addUnits(iu2);

    libcellml::ImportSourcePtr importIntermediary1 = libcellml::ImportSource::create();
    importIntermediary1->setUrl("I_am_a_url");
    importIntermediary1->setModel(intermediaryImportModel1);

    libcellml::ImportSourcePtr importIntermediary2 = libcellml::ImportSource::create();
    importIntermediary2->setUrl("I_am_a_url");
    importIntermediary2->setModel(intermediaryImportModel2);

    libcellml::UnitsPtr iu3 = libcellml::Units::create("per_fmol");
    iu3->setImportSource(importIntermediary1);
    iu3->setImportReference("per_fmol");

    libcellml::UnitsPtr iu4 = libcellml::Units::create("fmol");
    iu4->setImportSource(importIntermediary2);
    iu4->setImportReference("fmol");

    if (!variation.empty()) {
        libcellml::UnitsPtr u = libcellml::Units::create("fmol");
        u->addUnit("mole", "femto");
        if (variation == "int1") {
            intermediaryImportModel1->addUnits(u);
        } else if (variation == "main") {
            model->addUnits(u);
        }
    }

    model->addUnits(iu3);
    model->addUnits(iu4);
}